

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePath.h
# Opt level: O0

void __thiscall cmCMakePath::cmCMakePath(cmCMakePath *this,string_view source,format fmt)

{
  format in_R8B;
  string_view path;
  string local_48;
  format local_21;
  cmCMakePath *pcStack_20;
  format fmt_local;
  cmCMakePath *this_local;
  string_view source_local;
  
  path._M_len = source._M_str;
  this_local = (cmCMakePath *)source._M_len;
  path._M_str._0_1_ = fmt;
  path._M_str._1_7_ = 0;
  local_21 = fmt;
  pcStack_20 = this;
  source_local._M_len = (size_t)path._M_len;
  FormatPath_abi_cxx11_(&local_48,this_local,path,in_R8B);
  std::filesystem::__cxx11::path::path(&this->Path,&local_48,auto_format);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

cmCMakePath(cm::string_view source, format fmt = generic_format) noexcept
    : Path(FormatPath(source, fmt))
  {
  }